

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindPlatformMonitorForRect(ImRect *rect)

{
  bool bVar1;
  ImGuiPlatformMonitor *min;
  ImRect *in_RDI;
  float fVar2;
  float fVar3;
  float overlapping_surface;
  ImRect overlapping_rect;
  ImRect monitor_rect;
  ImGuiPlatformMonitor *monitor;
  int monitor_n;
  float best_monitor_surface;
  int best_monitor_n;
  float surface_threshold;
  int monitor_count;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff9c;
  ImVec2 local_50;
  ImRect local_48;
  ImGuiPlatformMonitor *local_38;
  int local_2c;
  float local_28;
  int local_24;
  float local_20;
  int local_1c;
  ImGuiContext *local_18;
  ImRect *local_10;
  int local_4;
  
  local_18 = GImGui;
  local_1c = (GImGui->PlatformIO).Monitors.Size;
  if (local_1c < 2) {
    local_4 = local_1c + -1;
  }
  else {
    local_10 = in_RDI;
    fVar2 = ImRect::GetWidth(in_RDI);
    fVar3 = ImRect::GetHeight(local_10);
    local_20 = ImMax<float>(fVar2 * fVar3 * 0.5,1.0);
    local_24 = -1;
    local_28 = 0.001;
    for (local_2c = 0; local_2c < (local_18->PlatformIO).Monitors.Size && local_28 < local_20;
        local_2c = local_2c + 1) {
      min = ImVector<ImGuiPlatformMonitor>::operator[](&(local_18->PlatformIO).Monitors,local_2c);
      local_38 = min;
      local_50 = ::operator+(in_stack_ffffffffffffff78,(ImVec2 *)0x1d1cbf);
      ImRect::ImRect(&local_48,&min->MainPos,&local_50);
      bVar1 = ImRect::Contains(&local_48,local_10);
      if (bVar1) {
        return local_2c;
      }
      ImRect::ClipWithFull
                ((ImRect *)local_10->Min,(ImRect *)CONCAT44(in_stack_ffffffffffffff9c,fVar2));
      in_stack_ffffffffffffff9c = ImRect::GetWidth((ImRect *)&stack0xffffffffffffffa0);
      fVar3 = ImRect::GetHeight((ImRect *)&stack0xffffffffffffffa0);
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c * fVar3;
      if (local_28 <= in_stack_ffffffffffffff9c) {
        local_24 = local_2c;
        local_28 = in_stack_ffffffffffffff9c;
      }
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

static int ImGui::FindPlatformMonitorForRect(const ImRect& rect)
{
    ImGuiContext& g = *GImGui;

    const int monitor_count = g.PlatformIO.Monitors.Size;
    if (monitor_count <= 1)
        return monitor_count - 1;

    // Use a minimum threshold of 1.0f so a zero-sized rect won't false positive, and will still find the correct monitor given its position.
    // This is necessary for tooltips which always resize down to zero at first.
    const float surface_threshold = ImMax(rect.GetWidth() * rect.GetHeight() * 0.5f, 1.0f);
    int best_monitor_n = -1;
    float best_monitor_surface = 0.001f;

    for (int monitor_n = 0; monitor_n < g.PlatformIO.Monitors.Size && best_monitor_surface < surface_threshold; monitor_n++)
    {
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[monitor_n];
        const ImRect monitor_rect = ImRect(monitor.MainPos, monitor.MainPos + monitor.MainSize);
        if (monitor_rect.Contains(rect))
            return monitor_n;
        ImRect overlapping_rect = rect;
        overlapping_rect.ClipWithFull(monitor_rect);
        float overlapping_surface = overlapping_rect.GetWidth() * overlapping_rect.GetHeight();
        if (overlapping_surface < best_monitor_surface)
            continue;
        best_monitor_surface = overlapping_surface;
        best_monitor_n = monitor_n;
    }
    return best_monitor_n;
}